

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

int secp256k1_jacobi32_maybe_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  secp256k1_scalar *a;
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  int extraout_EAX_03;
  uint32_t uVar6;
  int extraout_EAX_04;
  ulong uVar7;
  long lVar8;
  ulong extraout_RAX;
  byte bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  secp256k1_modinv32_signed30 *b;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar15;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar16;
  secp256k1_modinv32_signed30 *b_00;
  long *extraout_RDX_01;
  uint uVar17;
  secp256k1_modinv32_modinfo *unaff_RBX;
  secp256k1_modinv32_modinfo *psVar18;
  int *piVar19;
  secp256k1_modinv32_signed30 *psVar20;
  secp256k1_fe *psVar21;
  uint uVar22;
  uint uVar23;
  secp256k1_modinv32_modinfo *unaff_RBP;
  uint8_t *puVar24;
  uint uVar25;
  uint uVar26;
  secp256k1_modinv32_modinfo *psVar27;
  long lVar28;
  secp256k1_modinv32_signed30 *psVar29;
  secp256k1_fe *psVar30;
  secp256k1_fe *psVar31;
  secp256k1_fe *r;
  secp256k1_modinv32_modinfo *a_01;
  secp256k1_modinv32_modinfo *psVar32;
  secp256k1_modinv32_signed30 *a_02;
  secp256k1_modinv32_signed30 *a_03;
  long lVar33;
  ulong uVar34;
  secp256k1_fe *r_00;
  uchar *__s;
  uint uVar35;
  ulong uVar36;
  uint uVar37;
  secp256k1_modinv32_modinfo *psVar38;
  uint uVar39;
  int *piVar40;
  uint uVar41;
  secp256k1_modinv32_modinfo *unaff_R12;
  secp256k1_modinv32_modinfo *psVar42;
  secp256k1_modinv32_signed30 *psVar43;
  code *pcVar44;
  uint uVar45;
  ulong unaff_R13;
  secp256k1_modinv32_modinfo *psVar46;
  ulong uVar47;
  secp256k1_modinv32_signed30 *psVar48;
  size_t count;
  uint uVar49;
  secp256k1_modinv32_modinfo *unaff_R14;
  secp256k1_modinv32_modinfo *psVar50;
  secp256k1_modinv32_modinfo *psVar51;
  secp256k1_modinv32_modinfo *unaff_R15;
  secp256k1_modinv32_modinfo *modinfo_00;
  ulong uVar52;
  code *pcVar53;
  bool bVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 f;
  ulong uStack_1658;
  secp256k1_fe *psStack_1650;
  uchar auStack_1648 [4232];
  secp256k1_fe *psStack_5c0;
  code *pcStack_5b8;
  undefined8 uStack_5b0;
  secp256k1_fe *psStack_5a8;
  code *pcStack_5a0;
  code *pcStack_598;
  undefined1 auStack_590 [36];
  int iStack_56c;
  int iStack_568;
  int iStack_564;
  int iStack_560;
  int iStack_55c;
  int iStack_558;
  int iStack_554;
  undefined1 auStack_550 [48];
  code *pcStack_520;
  secp256k1_fe sStack_518;
  secp256k1_fe sStack_4e8;
  secp256k1_fe sStack_4b8;
  ulong uStack_480;
  ulong uStack_478;
  ulong uStack_470;
  secp256k1_modinv32_signed30 *psStack_468;
  ulong uStack_460;
  code *pcStack_458;
  uint uStack_450;
  uint uStack_44c;
  uint uStack_448;
  uint uStack_444;
  uint uStack_440;
  uint uStack_43c;
  secp256k1_modinv32_signed30 *psStack_438;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  uint uStack_420;
  int32_t iStack_41c;
  secp256k1_modinv32_signed30 *psStack_418;
  secp256k1_modinv32_signed30 *psStack_410;
  secp256k1_modinv32_signed30 *psStack_408;
  secp256k1_modinv32_signed30 *psStack_400;
  secp256k1_modinv32_signed30 *psStack_3f8;
  code *pcStack_3f0;
  long lStack_3e0;
  long lStack_3d8;
  int *piStack_3d0;
  secp256k1_modinv32_modinfo *psStack_3c8;
  ulong uStack_3c0;
  ulong uStack_3b0;
  code *pcStack_3a8;
  secp256k1_modinv32_signed30 *psStack_3a0;
  int *piStack_390;
  secp256k1_modinv32_modinfo *psStack_388;
  ulong uStack_380;
  ulong uStack_370;
  code *pcStack_368;
  secp256k1_modinv32_signed30 sStack_360;
  secp256k1_modinv32_signed30 sStack_33c;
  secp256k1_modinv32_modinfo *psStack_318;
  secp256k1_modinv32_modinfo *psStack_310;
  secp256k1_modinv32_modinfo *psStack_300;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  secp256k1_modinv32_modinfo sStack_2e8;
  secp256k1_modinv32_trans2x2 sStack_2b8;
  secp256k1_modinv32_modinfo sStack_2a8;
  secp256k1_modinv32_modinfo *psStack_278;
  long lStack_270;
  secp256k1_modinv32_modinfo sStack_268;
  secp256k1_modinv32_signed30 sStack_238;
  secp256k1_modinv32_modinfo *psStack_210;
  secp256k1_modinv32_modinfo *psStack_208;
  secp256k1_modinv32_modinfo *psStack_200;
  secp256k1_modinv32_modinfo *psStack_1f8;
  secp256k1_modinv32_modinfo *psStack_1f0;
  code *pcStack_1e8;
  uint uStack_1d4;
  secp256k1_modinv32_trans2x2 sStack_1d0;
  secp256k1_modinv32_modinfo sStack_1c0;
  uint uStack_194;
  secp256k1_modinv32_modinfo sStack_190;
  secp256k1_modinv32_modinfo *psStack_168;
  secp256k1_modinv32_modinfo *psStack_160;
  secp256k1_modinv32_modinfo *psStack_158;
  secp256k1_modinv32_modinfo sStack_150;
  secp256k1_modinv32_signed30 sStack_120;
  secp256k1_modinv32_modinfo *psStack_f8;
  secp256k1_modinv32_modinfo *psStack_f0;
  ulong uStack_e8;
  secp256k1_modinv32_modinfo *psStack_e0;
  secp256k1_modinv32_modinfo *psStack_d8;
  secp256k1_modinv32_modinfo *psStack_d0;
  int local_c0;
  int local_bc;
  secp256k1_modinv32_trans2x2 local_b8;
  secp256k1_modinv32_modinfo local_a8;
  int iStack_7c;
  secp256k1_modinv32_modinfo local_78;
  secp256k1_modinv32_modinfo *local_48;
  secp256k1_modinv32_modinfo *local_40;
  ulong local_38;
  
  local_78.modulus.v[8] = (modinfo->modulus).v[8];
  local_78.modulus.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  local_78.modulus.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  local_78.modulus.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  local_78.modulus.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  local_a8.modulus.v._8_8_ = *(undefined8 *)(x->v + 2);
  local_a8.modulus.v._16_8_ = *(undefined8 *)(x->v + 4);
  local_a8.modulus.v._24_8_ = *(undefined8 *)(x->v + 6);
  local_a8.modulus.v[0] = (int32_t)*(undefined8 *)x->v;
  local_a8.modulus.v[1] = (int32_t)((ulong)*(undefined8 *)x->v >> 0x20);
  local_a8.modulus.v[8] = x->v[8];
  auVar58 = packssdw(*(undefined1 (*) [16])x->v,*(undefined1 (*) [16])(x->v + 4));
  psVar32 = modinfo;
  if (((((((((auVar58 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar58 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar58 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar58 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar58 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar58 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar58 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar58[0xf]) &&
     (-1 < local_a8.modulus.v[8])) {
    uVar25 = local_a8.modulus.v[3] | local_a8.modulus.v[2] |
             local_a8.modulus.v[1] | local_a8.modulus.v[0];
    psVar32 = (secp256k1_modinv32_modinfo *)(ulong)uVar25;
    psVar51 = unaff_RBP;
    psVar50 = unaff_R14;
    if ((local_a8.modulus.v[7] != 0 ||
        ((local_a8.modulus.v[6] != 0 || (local_a8.modulus.v[5] != 0 || local_a8.modulus.v[4] != 0))
        || uVar25 != 0)) || local_a8.modulus.v[8] != 0) {
      psVar50 = (secp256k1_modinv32_modinfo *)0x9;
      unaff_R13 = 0xffffffff;
      local_bc = 0;
      unaff_R12 = (secp256k1_modinv32_modinfo *)0x0;
      local_48 = modinfo;
      do {
        modinfo = local_48;
        uVar17 = local_78.modulus.v[1] << 0x1e | local_78.modulus.v[0];
        unaff_RBX = (secp256k1_modinv32_modinfo *)(ulong)uVar17;
        uVar26 = local_a8.modulus.v[1] << 0x1e | local_a8.modulus.v[0];
        psVar32 = (secp256k1_modinv32_modinfo *)(ulong)uVar26;
        uVar25 = 1;
        psVar46 = (secp256k1_modinv32_modinfo *)0x0;
        uVar4 = 0x1e;
        x = (secp256k1_modinv32_signed30 *)0x0;
        uVar35 = 1;
        unaff_RBP = unaff_RBX;
        psVar42 = unaff_R12;
        uVar37 = uVar26;
        while( true ) {
          uVar39 = (uint)unaff_RBP;
          uVar22 = -1 << ((byte)uVar4 & 0x1f) | uVar37;
          uVar10 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          bVar9 = (byte)uVar10;
          uVar37 = uVar37 >> (bVar9 & 0x1f);
          uVar35 = uVar35 << (bVar9 & 0x1f);
          uVar22 = (int)x << (bVar9 & 0x1f);
          x = (secp256k1_modinv32_signed30 *)(ulong)uVar22;
          uVar45 = (int)unaff_R13 - uVar10;
          unaff_R13 = (ulong)uVar45;
          psVar51 = (secp256k1_modinv32_modinfo *)((ulong)unaff_RBP >> 1);
          uVar41 = ((uint)((ulong)unaff_RBP >> 2) ^ (uint)psVar51) & uVar10 ^ (uint)psVar42;
          unaff_R12 = (secp256k1_modinv32_modinfo *)(ulong)uVar41;
          uVar4 = uVar4 - uVar10;
          uVar10 = (uint)psVar46;
          local_40 = psVar50;
          if (uVar4 == 0) break;
          if (((ulong)unaff_RBP & 1) == 0) {
            psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be33;
            secp256k1_jacobi32_maybe_var_cold_6();
LAB_0014be33:
            psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be38;
            secp256k1_jacobi32_maybe_var_cold_5();
            unaff_R14 = psVar42;
LAB_0014be38:
            psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be3d;
            secp256k1_jacobi32_maybe_var_cold_1();
LAB_0014be3d:
            unaff_RBP = psVar51;
            psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be42;
            secp256k1_jacobi32_maybe_var_cold_2();
LAB_0014be42:
            psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be47;
            secp256k1_jacobi32_maybe_var_cold_4();
            goto LAB_0014be47;
          }
          if ((uVar37 & 1) == 0) goto LAB_0014be33;
          uVar23 = uVar22 * uVar26 + uVar35 * uVar17;
          psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar23;
          bVar9 = 0x1e - (char)uVar4;
          uVar49 = uVar39 << (bVar9 & 0x1f);
          unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar49;
          if (uVar23 != uVar49) goto LAB_0014be38;
          uVar49 = uVar25 * uVar26 + uVar10 * uVar17;
          unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar49;
          uVar23 = uVar37 << (bVar9 & 0x1f);
          psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar23;
          if (uVar49 != uVar23) goto LAB_0014be3d;
          unaff_R14 = psVar46;
          if ((int)uVar45 < 0) {
            unaff_R13 = (ulong)-uVar45;
            unaff_R12 = (secp256k1_modinv32_modinfo *)(ulong)(uVar41 ^ (uVar37 & uVar39) >> 1);
            unaff_RBP = (secp256k1_modinv32_modinfo *)(ulong)uVar37;
            x = (secp256k1_modinv32_signed30 *)(ulong)uVar25;
            unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar35;
            uVar35 = uVar10;
            uVar37 = uVar39;
            uVar25 = uVar22;
          }
          unaff_R15 = (secp256k1_modinv32_modinfo *)(ulong)uVar25;
          uVar10 = (int)unaff_R13 + 1;
          if ((int)uVar4 <= (int)uVar10) {
            uVar10 = uVar4;
          }
          if (0x1e < uVar10) goto LAB_0014be42;
          uVar10 = (uint)(0xff << (-(char)uVar10 & 0x1fU)) >> (-(char)uVar10 & 0x1fU);
          uVar39 = secp256k1_modinv32_inv256[(uint)((ulong)unaff_RBP >> 1) & 0x7f] * uVar37 & uVar10
          ;
          uVar37 = uVar39 * (int)unaff_RBP + uVar37;
          psVar46 = (secp256k1_modinv32_modinfo *)(ulong)(uVar39 * uVar35 + (int)unaff_R14);
          uVar25 = uVar39 * (int)x + uVar25;
          psVar42 = unaff_R12;
          local_38 = unaff_R13;
          if ((uVar37 & uVar10) != 0) {
LAB_0014be47:
            psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be4c;
            secp256k1_jacobi32_maybe_var_cold_3();
            goto LAB_0014be4c;
          }
        }
        lVar8 = (long)(int)uVar25 * (long)(int)uVar35 - (long)(int)uVar10 * (long)(int)uVar22;
        unaff_R15 = &local_78;
        local_b8.u = uVar35;
        local_b8.v = uVar22;
        local_b8.q = uVar10;
        local_b8.r = uVar25;
        if ((lVar8 != -0x40000000) && (lVar8 != 0x40000000)) goto LAB_0014be7e;
        iVar11 = (int)psVar50;
        psStack_d0 = (secp256k1_modinv32_modinfo *)0x14bccd;
        psVar32 = psVar50;
        x = &unaff_R15->modulus;
        iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar11,&local_48->modulus,0);
        unaff_RBP = &local_a8;
        if (iVar5 < 1) goto LAB_0014be51;
        psStack_d0 = (secp256k1_modinv32_modinfo *)0x14bced;
        psVar32 = psVar50;
        x = &unaff_R15->modulus;
        iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar11,&modinfo->modulus,1);
        if (0 < iVar5) goto LAB_0014be56;
        psStack_d0 = (secp256k1_modinv32_modinfo *)0x14bd05;
        psVar32 = psVar50;
        x = &unaff_RBP->modulus;
        iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_RBP->modulus,iVar11,&modinfo->modulus,0);
        if (iVar5 < 1) goto LAB_0014be5b;
        psStack_d0 = (secp256k1_modinv32_modinfo *)0x14bd20;
        psVar32 = psVar50;
        x = &unaff_RBP->modulus;
        iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_RBP->modulus,iVar11,&modinfo->modulus,1);
        if (-1 < iVar5) goto LAB_0014be60;
        psStack_d0 = (secp256k1_modinv32_modinfo *)0x14bd3b;
        secp256k1_modinv32_update_fg_30_var
                  (iVar11,&unaff_R15->modulus,&unaff_RBP->modulus,&local_b8);
        if (local_78.modulus.v[0] == 1) {
          if (1 < iVar11) {
            uVar25 = 0;
            psVar32 = (secp256k1_modinv32_modinfo *)0x1;
            do {
              uVar25 = uVar25 | local_78.modulus.v[(long)psVar32];
              psVar32 = (secp256k1_modinv32_modinfo *)((long)(psVar32->modulus).v + 1);
            } while (psVar50 != psVar32);
            if (uVar25 != 0) goto LAB_0014bd6a;
          }
          local_c0 = 1 - (uVar41 * 2 & 2);
          bVar54 = false;
        }
        else {
LAB_0014bd6a:
          if ((-1 < iVar11 + -2 && (&iStack_7c)[iVar11] == 0) &&
              local_a8.modulus.v[(long)iVar11 + -1] == 0) {
            psVar50 = (secp256k1_modinv32_modinfo *)(ulong)(iVar11 - 1);
          }
          psStack_d0 = (secp256k1_modinv32_modinfo *)0x14bd94;
          iVar11 = (int)psVar50;
          psVar32 = psVar50;
          x = &unaff_R15->modulus;
          iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar11,&modinfo->modulus,0);
          if (iVar5 < 1) goto LAB_0014be65;
          psStack_d0 = (secp256k1_modinv32_modinfo *)0x14bdaf;
          psVar32 = psVar50;
          x = &unaff_R15->modulus;
          iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar11,&modinfo->modulus,1);
          if (0 < iVar5) goto LAB_0014be6a;
          psStack_d0 = (secp256k1_modinv32_modinfo *)0x14bdc7;
          psVar32 = psVar50;
          x = &unaff_RBP->modulus;
          iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_RBP->modulus,iVar11,&modinfo->modulus,0);
          if (iVar5 < 1) goto LAB_0014be6f;
          psStack_d0 = (secp256k1_modinv32_modinfo *)0x14bde2;
          psVar32 = psVar50;
          x = &unaff_RBP->modulus;
          iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_RBP->modulus,iVar11,&modinfo->modulus,1);
          bVar54 = true;
          if (-1 < iVar5) goto LAB_0014be74;
        }
        if (!bVar54) {
          return local_c0;
        }
        local_bc = local_bc + 1;
        if (local_bc == 0x19) {
          return 0;
        }
      } while( true );
    }
  }
  else {
LAB_0014be4c:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be51;
    secp256k1_jacobi32_maybe_var_cold_17();
    modinfo = unaff_RBX;
    psVar50 = unaff_R14;
LAB_0014be51:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be56;
    secp256k1_jacobi32_maybe_var_cold_14();
LAB_0014be56:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be5b;
    secp256k1_jacobi32_maybe_var_cold_13();
LAB_0014be5b:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be60;
    secp256k1_jacobi32_maybe_var_cold_12();
LAB_0014be60:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be65;
    secp256k1_jacobi32_maybe_var_cold_11();
LAB_0014be65:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be6a;
    secp256k1_jacobi32_maybe_var_cold_10();
LAB_0014be6a:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be6f;
    secp256k1_jacobi32_maybe_var_cold_9();
LAB_0014be6f:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be74;
    secp256k1_jacobi32_maybe_var_cold_8();
LAB_0014be74:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be79;
    secp256k1_jacobi32_maybe_var_cold_7();
    psVar51 = unaff_RBP;
  }
  psStack_d0 = (secp256k1_modinv32_modinfo *)0x14be7e;
  secp256k1_jacobi32_maybe_var_cold_16();
LAB_0014be7e:
  psStack_d0 = (secp256k1_modinv32_modinfo *)secp256k1_modinv32_var;
  secp256k1_jacobi32_maybe_var_cold_15();
  psStack_d0 = psVar51;
  psStack_d8 = unaff_R15;
  psStack_e0 = psVar50;
  uStack_e8 = unaff_R13;
  psStack_f0 = unaff_R12;
  psStack_f8 = modinfo;
  psVar51 = (secp256k1_modinv32_modinfo *)0x0;
  sStack_150.modulus.v[8] = 0;
  sStack_150.modulus.v[4] = 0;
  sStack_150.modulus.v[5] = 0;
  sStack_150.modulus.v[6] = 0;
  sStack_150.modulus.v[7] = 0;
  sStack_150.modulus.v[0] = 0;
  sStack_150.modulus.v[1] = 0;
  sStack_150.modulus.v[2] = 0;
  sStack_150.modulus.v[3] = 0;
  sStack_120.v[2] = 0;
  sStack_120.v[3] = 0;
  sStack_120.v[8] = 0;
  sStack_120.v[4] = 0;
  sStack_120.v[5] = 0;
  sStack_120.v[6] = 0;
  sStack_120.v[7] = 0;
  sStack_120.v[0] = 1;
  sStack_120.v[1] = 0;
  sStack_190.modulus.v[8] = (psVar32->modulus).v[8];
  sStack_190.modulus.v._16_8_ = *(undefined8 *)((psVar32->modulus).v + 4);
  sStack_190.modulus.v._24_8_ = *(undefined8 *)((psVar32->modulus).v + 6);
  sStack_190.modulus.v._0_8_ = *(ulong *)(psVar32->modulus).v;
  sStack_190.modulus.v._8_8_ = *(undefined8 *)((psVar32->modulus).v + 2);
  sStack_1c0.modulus.v[8] = (((secp256k1_modinv32_modinfo *)x)->modulus).v[8];
  sStack_1c0.modulus.v._0_8_ = *(undefined8 *)(((secp256k1_modinv32_modinfo *)x)->modulus).v;
  sStack_1c0.modulus.v._8_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 2);
  psStack_168 = (secp256k1_modinv32_modinfo *)x;
  sStack_1c0.modulus.v._16_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 4);
  sStack_1c0.modulus.v._24_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 6);
  psVar42 = (secp256k1_modinv32_modinfo *)0xffffffff;
  psVar50 = (secp256k1_modinv32_modinfo *)0x9;
  puVar24 = secp256k1_modinv32_inv256;
  psStack_160 = psVar32;
  do {
    modinfo_00 = psStack_160;
    uStack_1d4 = (uint)psVar51;
    psVar27 = (secp256k1_modinv32_modinfo *)(sStack_190.modulus.v._0_8_ & 0xffffffff);
    a_01 = (secp256k1_modinv32_modinfo *)(sStack_1c0.modulus.v._0_8_ & 0xffffffff);
    uVar25 = 1;
    psVar38 = (secp256k1_modinv32_modinfo *)0x0;
    iVar5 = 0x1e;
    uVar4 = 0;
    psVar46 = (secp256k1_modinv32_modinfo *)0x1;
    uVar35 = sStack_190.modulus.v[0];
    uVar37 = sStack_1c0.modulus.v[0];
    while( true ) {
      uVar17 = -1 << ((byte)iVar5 & 0x1f) | uVar37;
      psVar18 = (secp256k1_modinv32_modinfo *)(ulong)uVar17;
      iVar11 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
        }
      }
      bVar9 = (byte)iVar11;
      uVar37 = uVar37 >> (bVar9 & 0x1f);
      uVar26 = (int)psVar46 << (bVar9 & 0x1f);
      psVar46 = (secp256k1_modinv32_modinfo *)(ulong)uVar26;
      uVar4 = uVar4 << (bVar9 & 0x1f);
      uVar17 = (int)psVar42 - iVar11;
      psVar42 = (secp256k1_modinv32_modinfo *)(ulong)uVar17;
      iVar5 = iVar5 - iVar11;
      iVar11 = (int)psVar38;
      psStack_158 = psVar50;
      if (iVar5 == 0) break;
      if ((uVar35 & 1) == 0) {
        pcStack_1e8 = (code *)0x14c341;
        secp256k1_modinv32_var_cold_7();
LAB_0014c341:
        pcStack_1e8 = (code *)0x14c346;
        secp256k1_modinv32_var_cold_6();
LAB_0014c346:
        pcStack_1e8 = (code *)0x14c34b;
        secp256k1_modinv32_var_cold_1();
LAB_0014c34b:
        pcStack_1e8 = (code *)0x14c350;
        secp256k1_modinv32_var_cold_2();
LAB_0014c350:
        pcStack_1e8 = (code *)0x14c355;
        secp256k1_modinv32_var_cold_5();
LAB_0014c355:
        pcStack_1e8 = (code *)0x14c35a;
        secp256k1_modinv32_var_cold_4();
        goto LAB_0014c35a;
      }
      if ((uVar37 & 1) == 0) goto LAB_0014c341;
      uVar10 = uVar4 * sStack_1c0.modulus.v[0] + uVar26 * sStack_190.modulus.v[0];
      psVar18 = (secp256k1_modinv32_modinfo *)(ulong)uVar10;
      bVar9 = 0x1e - (char)iVar5;
      uVar39 = uVar35 << (bVar9 & 0x1f);
      psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
      if (uVar10 != uVar39) goto LAB_0014c346;
      uVar39 = uVar25 * sStack_1c0.modulus.v[0] + iVar11 * sStack_190.modulus.v[0];
      psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
      uVar10 = uVar37 << (bVar9 & 0x1f);
      psVar18 = (secp256k1_modinv32_modinfo *)(ulong)uVar10;
      if (uVar39 != uVar10) goto LAB_0014c34b;
      if (uVar17 - 0x2f0 < 0xfffffa21) goto LAB_0014c350;
      psVar51 = psVar38;
      if ((int)uVar17 < 0) {
        psVar42 = (secp256k1_modinv32_modinfo *)(ulong)-uVar17;
        uVar17 = -uVar35;
        uVar10 = -uVar4;
        psVar46 = psVar38;
        psVar51 = (secp256k1_modinv32_modinfo *)(ulong)-uVar26;
        uVar35 = uVar37;
        uVar37 = uVar17;
        uVar4 = uVar25;
        uVar25 = uVar10;
      }
      psVar18 = (secp256k1_modinv32_modinfo *)(ulong)uVar25;
      iVar11 = (int)psVar42 + 1;
      if (iVar5 <= iVar11) {
        iVar11 = iVar5;
      }
      if (iVar11 - 0x1fU < 0xffffffe2) goto LAB_0014c355;
      uVar26 = (uint)(0xff << (-(char)iVar11 & 0x1fU)) >> (-(char)iVar11 & 0x1fU);
      psVar32 = (secp256k1_modinv32_modinfo *)(ulong)uVar26;
      uVar17 = secp256k1_modinv32_inv256[uVar35 >> 1 & 0x7f] * uVar37 & uVar26;
      uVar37 = uVar37 + uVar17 * uVar35;
      psVar38 = (secp256k1_modinv32_modinfo *)(ulong)(uVar17 * (int)psVar46 + (int)psVar51);
      uVar25 = uVar17 * uVar4 + uVar25;
      if ((uVar37 & uVar26) != 0) {
LAB_0014c35a:
        pcStack_1e8 = (code *)0x14c35f;
        secp256k1_modinv32_var_cold_3();
        goto LAB_0014c35f;
      }
    }
    sStack_1d0.u = uVar26;
    sStack_1d0.v = uVar4;
    sStack_1d0.q = iVar11;
    sStack_1d0.r = uVar25;
    if ((long)(int)uVar25 * (long)(int)uVar26 - (long)iVar11 * (long)(int)uVar4 != 0x40000000) {
LAB_0014c35f:
      pcStack_1e8 = (code *)0x14c364;
      secp256k1_modinv32_var_cold_8();
      psVar50 = psVar18;
      modinfo_00 = psVar32;
LAB_0014c364:
      pcStack_1e8 = (code *)0x14c369;
      secp256k1_modinv32_var_cold_19();
LAB_0014c369:
      pcStack_1e8 = (code *)0x14c36e;
      secp256k1_modinv32_var_cold_18();
LAB_0014c36e:
      pcStack_1e8 = (code *)0x14c373;
      secp256k1_modinv32_var_cold_17();
LAB_0014c373:
      pcStack_1e8 = (code *)0x14c378;
      secp256k1_modinv32_var_cold_16();
LAB_0014c378:
      pcStack_1e8 = (code *)0x14c37d;
      secp256k1_modinv32_var_cold_13();
LAB_0014c37d:
      pcStack_1e8 = (code *)0x14c382;
      secp256k1_modinv32_var_cold_12();
LAB_0014c382:
      pcStack_1e8 = (code *)0x14c387;
      secp256k1_modinv32_var_cold_11();
LAB_0014c387:
      pcStack_1e8 = (code *)0x14c38c;
      secp256k1_modinv32_var_cold_10();
LAB_0014c38c:
      pcStack_1e8 = (code *)0x14c391;
      secp256k1_modinv32_var_cold_9();
      goto LAB_0014c391;
    }
    pcStack_1e8 = (code *)0x14c0c2;
    secp256k1_modinv32_update_de_30(&sStack_150.modulus,&sStack_120,&sStack_1d0,psStack_160);
    psVar50 = psStack_158;
    psVar46 = &sStack_190;
    iVar11 = (int)psStack_158;
    psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psStack_158 & 0xffffffff);
    pcStack_1e8 = (code *)0x14c0e1;
    a_01 = psVar46;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar46->modulus,iVar11,&modinfo_00->modulus,-1);
    if (iVar5 < 1) goto LAB_0014c364;
    psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
    pcStack_1e8 = (code *)0x14c0fb;
    a_01 = psVar46;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar46->modulus,iVar11,&modinfo_00->modulus,1);
    if (0 < iVar5) goto LAB_0014c369;
    psVar51 = &sStack_1c0;
    psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
    pcStack_1e8 = (code *)0x14c11a;
    a_01 = psVar51;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar51->modulus,iVar11,&modinfo_00->modulus,-1);
    if (iVar5 < 1) goto LAB_0014c36e;
    psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
    pcStack_1e8 = (code *)0x14c134;
    a_01 = psVar51;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar51->modulus,iVar11,&modinfo_00->modulus,1);
    if (-1 < iVar5) goto LAB_0014c373;
    pcStack_1e8 = (code *)0x14c14e;
    secp256k1_modinv32_update_fg_30_var(iVar11,&psVar46->modulus,&psVar51->modulus,&sStack_1d0);
    uVar25 = uStack_1d4;
    psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uStack_1d4;
    if (sStack_1c0.modulus.v[0] != 0) {
LAB_0014c15e:
      uVar35 = (&uStack_194)[iVar11];
      uVar37 = sStack_1c0.modulus.v[(long)iVar11 + -1];
      iVar5 = iVar11 + -2;
      uVar4 = (int)uVar35 >> 0x1f ^ uVar35 | iVar5 >> 0x1f;
      a_01 = (secp256k1_modinv32_modinfo *)(ulong)uVar4;
      uVar4 = (int)uVar37 >> 0x1f ^ uVar37 | uVar4;
      psVar27 = (secp256k1_modinv32_modinfo *)(ulong)uVar4;
      if (uVar4 == 0) {
        psVar50 = (secp256k1_modinv32_modinfo *)(ulong)(iVar11 - 1);
        piVar16 = sStack_190.modulus.v + iVar5;
        *piVar16 = *piVar16 | uVar35 << 0x1e;
        piVar16 = sStack_1c0.modulus.v + iVar5;
        *piVar16 = *piVar16 | uVar37 << 0x1e;
      }
      if (0x17 < (int)uStack_1d4) goto LAB_0014c378;
      iVar11 = (int)psVar50;
      psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
      pcStack_1e8 = (code *)0x14c1b4;
      a_01 = psVar46;
      iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar46->modulus,iVar11,&modinfo_00->modulus,-1);
      if (iVar5 < 1) goto LAB_0014c37d;
      psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
      pcStack_1e8 = (code *)0x14c1ce;
      a_01 = psVar46;
      iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar46->modulus,iVar11,&modinfo_00->modulus,1);
      if (0 < iVar5) goto LAB_0014c382;
      psVar46 = &sStack_1c0;
      psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
      pcStack_1e8 = (code *)0x14c1ed;
      a_01 = psVar46;
      iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar46->modulus,iVar11,&modinfo_00->modulus,-1);
      if (iVar5 < 1) goto LAB_0014c387;
      psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
      pcStack_1e8 = (code *)0x14c207;
      a_01 = psVar46;
      iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar46->modulus,iVar11,&modinfo_00->modulus,1);
      if (iVar5 < 0) {
        psVar51 = (secp256k1_modinv32_modinfo *)(ulong)(uVar25 + 1);
        uVar35 = 1;
        goto LAB_0014c23a;
      }
      goto LAB_0014c38c;
    }
    uVar35 = 0;
    if (1 < iVar11) {
      uVar52 = 1;
      do {
        uVar35 = uVar35 | sStack_1c0.modulus.v[uVar52];
        uVar52 = uVar52 + 1;
      } while (((ulong)psVar50 & 0xffffffff) != uVar52);
      if (uVar35 != 0) goto LAB_0014c15e;
      uVar35 = 0;
    }
LAB_0014c23a:
    psVar32 = modinfo_00;
  } while ((char)uVar35 != '\0');
  a_01 = &sStack_1c0;
  iVar11 = (int)psVar50;
  psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
  pcStack_1e8 = (code *)0x14c257;
  iVar5 = secp256k1_modinv32_mul_cmp_30(&a_01->modulus,iVar11,&SECP256K1_SIGNED30_ONE,0);
  if (iVar5 == 0) {
    pcStack_1e8 = (code *)0x14c277;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&sStack_190.modulus,iVar11,&SECP256K1_SIGNED30_ONE,-1);
    psVar51 = psStack_168;
    if (iVar5 == 0) {
LAB_0014c2f9:
      pcStack_1e8 = (code *)0x14c313;
      secp256k1_modinv32_normalize_30(&sStack_150.modulus,(&uStack_194)[iVar11],modinfo_00);
      (psVar51->modulus).v[8] = sStack_150.modulus.v[8];
      *(undefined8 *)((psVar51->modulus).v + 4) = sStack_150.modulus.v._16_8_;
      *(undefined8 *)((psVar51->modulus).v + 6) = sStack_150.modulus.v._24_8_;
      *(undefined8 *)(psVar51->modulus).v = sStack_150.modulus.v._0_8_;
      *(undefined8 *)((psVar51->modulus).v + 2) = sStack_150.modulus.v._8_8_;
      return sStack_150.modulus.v[8];
    }
    pcStack_1e8 = (code *)0x14c298;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&sStack_190.modulus,iVar11,&SECP256K1_SIGNED30_ONE,1);
    if (iVar5 == 0) goto LAB_0014c2f9;
    psVar27 = (secp256k1_modinv32_modinfo *)0x9;
    pcStack_1e8 = (code *)0x14c2b2;
    a_01 = psVar51;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar51->modulus,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar5 == 0) {
      a_01 = &sStack_150;
      psVar27 = (secp256k1_modinv32_modinfo *)0x9;
      pcStack_1e8 = (code *)0x14c2d5;
      iVar5 = secp256k1_modinv32_mul_cmp_30(&a_01->modulus,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar5 == 0) {
        a_01 = &sStack_190;
        psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
        pcStack_1e8 = (code *)0x14c2f1;
        iVar5 = secp256k1_modinv32_mul_cmp_30(&a_01->modulus,iVar11,&modinfo_00->modulus,1);
        if (iVar5 == 0) goto LAB_0014c2f9;
      }
    }
  }
  else {
LAB_0014c391:
    pcStack_1e8 = (code *)0x14c396;
    secp256k1_modinv32_var_cold_14();
  }
  pcStack_1e8 = secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  pcStack_1e8 = (code *)secp256k1_modinv32_inv256;
  psStack_1f0 = modinfo_00;
  psStack_1f8 = psVar51;
  psStack_200 = psVar46;
  psStack_208 = psVar42;
  psStack_210 = psVar50;
  uVar25 = 0;
  sStack_268.modulus.v[8] = 0;
  sStack_268.modulus.v[4] = 0;
  sStack_268.modulus.v[5] = 0;
  sStack_268.modulus.v[6] = 0;
  sStack_268.modulus.v[7] = 0;
  sStack_268.modulus.v[0] = 0;
  sStack_268.modulus.v[1] = 0;
  sStack_268.modulus.v[2] = 0;
  sStack_268.modulus.v[3] = 0;
  sStack_238.v[2] = 0;
  sStack_238.v[3] = 0;
  sStack_238.v[8] = 0;
  sStack_238.v[4] = 0;
  sStack_238.v[5] = 0;
  sStack_238.v[6] = 0;
  sStack_238.v[7] = 0;
  sStack_238.v[0] = 1;
  sStack_238.v[1] = 0;
  sStack_2e8.modulus.v[8] = (psVar27->modulus).v[8];
  sStack_2e8.modulus.v._16_8_ = *(undefined8 *)((psVar27->modulus).v + 4);
  sStack_2e8.modulus.v._24_8_ = *(undefined8 *)((psVar27->modulus).v + 6);
  sStack_2e8.modulus.v._0_8_ = *(undefined8 *)(psVar27->modulus).v;
  sStack_2e8.modulus.v._8_8_ = *(undefined8 *)((psVar27->modulus).v + 2);
  sStack_2a8.modulus.v[8] = (a_01->modulus).v[8];
  sStack_2a8.modulus.v._0_8_ = *(undefined8 *)(a_01->modulus).v;
  sStack_2a8.modulus.v._8_8_ = *(undefined8 *)((a_01->modulus).v + 2);
  psStack_278 = a_01;
  sStack_2a8.modulus.v._16_8_ = *(undefined8 *)((a_01->modulus).v + 4);
  sStack_2a8.modulus.v._24_8_ = *(undefined8 *)((a_01->modulus).v + 6);
  uVar52 = 0xffffffff;
  psStack_300 = psVar27;
  do {
    lStack_270 = (long)sStack_2e8.modulus.v[0];
    uVar47 = (ulong)sStack_2a8.modulus.v[0];
    uVar13 = 0;
    psVar32 = (secp256k1_modinv32_modinfo *)0x1;
    uVar35 = 0;
    uVar17 = 0;
    uVar26 = 1;
    uVar37 = sStack_2a8.modulus.v[0];
    uVar4 = sStack_2e8.modulus.v[0];
    do {
      uVar10 = sStack_2e8.modulus.v[0];
      uStack_2f4 = uVar25;
      if ((uVar4 & 1) == 0) {
        psStack_310 = (secp256k1_modinv32_modinfo *)0x14c852;
        secp256k1_modinv32_cold_17();
LAB_0014c852:
        psStack_310 = (secp256k1_modinv32_modinfo *)0x14c857;
        secp256k1_modinv32_cold_1();
LAB_0014c857:
        psStack_310 = (secp256k1_modinv32_modinfo *)0x14c85c;
        secp256k1_modinv32_cold_2();
        psVar46 = psVar42;
LAB_0014c85c:
        psStack_310 = (secp256k1_modinv32_modinfo *)0x14c861;
        secp256k1_modinv32_cold_16();
        goto LAB_0014c861;
      }
      uVar41 = (uint)psVar32;
      uVar22 = uVar35 * sStack_2a8.modulus.v[0] + uVar41 * sStack_2e8.modulus.v[0];
      puVar24 = (uint8_t *)(ulong)uVar22;
      uVar39 = uVar4 << ((byte)uVar13 & 0x1f);
      psVar50 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
      if (uVar22 != uVar39) goto LAB_0014c852;
      uVar22 = uVar26 * sStack_2a8.modulus.v[0] + uVar17 * sStack_2e8.modulus.v[0];
      puVar24 = (uint8_t *)(ulong)uVar22;
      uVar39 = uVar37 << ((byte)uVar13 & 0x1f);
      psVar50 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
      if (uVar22 != uVar39) goto LAB_0014c857;
      uStack_2ec = (int)(uint)uVar52 >> 0x1f;
      puVar24 = (uint8_t *)(ulong)uStack_2ec;
      uStack_2f0 = uVar37 & 1;
      uVar39 = -uStack_2f0;
      psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
      uVar22 = uStack_2ec & uVar39;
      psVar50 = (secp256k1_modinv32_modinfo *)(ulong)uVar22;
      uVar45 = (uint)uVar52 ^ uVar22;
      uVar52 = (ulong)uVar45;
      psVar46 = (secp256k1_modinv32_modinfo *)(ulong)(uVar45 - 0x25b);
      if (uVar45 - 0x25b < 0xfffffb4d) goto LAB_0014c85c;
      uVar52 = (ulong)(uVar45 - 1);
      uVar26 = uVar26 + ((uStack_2ec ^ uVar35) - uStack_2ec & uVar39);
      uVar35 = (uVar35 + (uVar26 & uVar22)) * 2;
      uVar17 = uVar17 + ((uStack_2ec ^ uVar41) - uStack_2ec & uVar39);
      uVar41 = (uVar41 + (uVar17 & uVar22)) * 2;
      psVar32 = (secp256k1_modinv32_modinfo *)(ulong)uVar41;
      uVar39 = ((uStack_2ec ^ uVar4) - uStack_2ec & uVar39) + uVar37;
      uVar37 = uVar39 >> 1;
      uVar39 = uVar39 & uVar22;
      psVar42 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
      uVar4 = uVar4 + uVar39;
      uVar39 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar39;
    } while (uVar39 != 0x1e);
    psVar50 = (secp256k1_modinv32_modinfo *)(long)(int)uVar41;
    psVar51 = (secp256k1_modinv32_modinfo *)(long)(int)uVar26;
    puVar24 = (uint8_t *)(long)(int)uVar35;
    psVar46 = (secp256k1_modinv32_modinfo *)(long)(int)uVar17;
    uVar13 = (long)psVar50 * (long)psVar51 - (long)puVar24 * (long)psVar46;
    sStack_2b8.u = uVar41;
    sStack_2b8.v = uVar35;
    sStack_2b8.q = uVar17;
    sStack_2b8.r = uVar26;
    if (uVar13 != 0x40000000) {
LAB_0014c861:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x14c866;
      secp256k1_modinv32_cold_3();
LAB_0014c866:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x14c86b;
      secp256k1_modinv32_cold_15();
LAB_0014c86b:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x14c870;
      secp256k1_modinv32_cold_14();
LAB_0014c870:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x14c875;
      secp256k1_modinv32_cold_13();
LAB_0014c875:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x14c87a;
      secp256k1_modinv32_cold_12();
LAB_0014c87a:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x14c87f;
      secp256k1_modinv32_cold_4();
LAB_0014c87f:
      psVar42 = psVar46;
      uVar25 = (uint)uVar13;
      psStack_310 = (secp256k1_modinv32_modinfo *)0x14c884;
      secp256k1_modinv32_cold_5();
LAB_0014c884:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x14c889;
      secp256k1_modinv32_cold_11();
LAB_0014c889:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x14c88e;
      secp256k1_modinv32_cold_10();
LAB_0014c88e:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x14c893;
      secp256k1_modinv32_cold_9();
LAB_0014c893:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x14c898;
      secp256k1_modinv32_cold_8();
      goto LAB_0014c898;
    }
    psStack_310 = (secp256k1_modinv32_modinfo *)0x14c584;
    secp256k1_modinv32_update_de_30(&sStack_268.modulus,&sStack_238,&sStack_2b8,psStack_300);
    psVar32 = &sStack_2e8;
    uVar10 = 9;
    uVar13 = 0xffffffff;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x14c59d;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&psStack_300->modulus,-1);
    if (iVar5 < 1) goto LAB_0014c866;
    psVar32 = &sStack_2e8;
    uVar10 = 9;
    uVar13 = 1;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x14c5be;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&psStack_300->modulus,1);
    if (0 < iVar5) goto LAB_0014c86b;
    psVar32 = &sStack_2a8;
    uVar10 = 9;
    uVar13 = 0xffffffff;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x14c5df;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&psStack_300->modulus,-1);
    if (iVar5 < 1) goto LAB_0014c870;
    psVar32 = &sStack_2a8;
    uVar10 = 9;
    uVar13 = 1;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x14c600;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&psStack_300->modulus,1);
    psVar42 = psStack_300;
    if (-1 < iVar5) goto LAB_0014c875;
    uVar13 = (long)psVar50 * lStack_270;
    uVar7 = (long)puVar24 * uVar47 + uVar13;
    if ((uVar7 & 0x3ffffffe) != 0) goto LAB_0014c87a;
    uVar47 = uVar47 * (long)psVar51 + lStack_270 * (long)psVar46;
    if ((uVar47 & 0x3fffffff) != 0) goto LAB_0014c87f;
    uVar47 = (long)uVar47 >> 0x1e;
    lVar8 = (long)uVar7 >> 0x1e;
    lVar14 = 1;
    do {
      lVar15 = (long)sStack_2e8.modulus.v[lVar14];
      lVar28 = (long)sStack_2a8.modulus.v[lVar14];
      lVar8 = lVar28 * (long)puVar24 + lVar15 * (long)psVar50 + lVar8;
      lVar15 = lVar28 * (long)psVar51 + lVar15 * (long)psVar46 + uVar47;
      (&uStack_2ec)[lVar14] = (uint)lVar8 & 0x3fffffff;
      sStack_2a8.modulus.v[lVar14 + -1] = (uint)lVar15 & 0x3fffffff;
      lVar14 = lVar14 + 1;
      uVar47 = lVar15 >> 0x1e;
      lVar8 = lVar8 >> 0x1e;
    } while (lVar14 != 9);
    sStack_2e8.modulus.v[8] = (int32_t)lVar8;
    sStack_2a8.modulus.v[8] = (int32_t)uVar47;
    psVar50 = &sStack_2e8;
    uVar10 = 9;
    uVar25 = 0xffffffff;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x14c6d4;
    psVar32 = psVar50;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar50->modulus,9,&psStack_300->modulus,-1);
    if (iVar5 < 1) goto LAB_0014c884;
    uVar10 = 9;
    uVar25 = 1;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x14c6f1;
    psVar32 = psVar50;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar50->modulus,9,&psVar42->modulus,1);
    if (0 < iVar5) goto LAB_0014c889;
    psVar50 = &sStack_2a8;
    uVar10 = 9;
    uVar25 = 0xffffffff;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x14c713;
    psVar32 = psVar50;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar50->modulus,9,&psVar42->modulus,-1);
    if (iVar5 < 1) goto LAB_0014c88e;
    uVar10 = 9;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x14c730;
    psVar32 = psVar50;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar50->modulus,9,&psVar42->modulus,1);
    uVar25 = uStack_2f4;
    if (-1 < iVar5) goto LAB_0014c893;
    uVar25 = uStack_2f4 + 1;
  } while (uVar25 != 0x14);
  psVar32 = &sStack_2a8;
  uVar10 = 9;
  uVar25 = 0;
  psStack_310 = (secp256k1_modinv32_modinfo *)0x14c75f;
  iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar5 == 0) {
    psStack_310 = (secp256k1_modinv32_modinfo *)0x14c782;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&sStack_2e8.modulus,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar51 = psStack_278;
    if (iVar5 == 0) {
LAB_0014c80d:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x14c824;
      secp256k1_modinv32_normalize_30(&sStack_268.modulus,sStack_2e8.modulus.v[8],psVar42);
      (psVar51->modulus).v[8] = sStack_268.modulus.v[8];
      *(undefined8 *)((psVar51->modulus).v + 4) = sStack_268.modulus.v._16_8_;
      *(undefined8 *)((psVar51->modulus).v + 6) = sStack_268.modulus.v._24_8_;
      *(undefined8 *)(psVar51->modulus).v = sStack_268.modulus.v._0_8_;
      *(undefined8 *)((psVar51->modulus).v + 2) = sStack_268.modulus.v._8_8_;
      return sStack_268.modulus.v[8];
    }
    psStack_310 = (secp256k1_modinv32_modinfo *)0x14c7a9;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&sStack_2e8.modulus,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar5 == 0) goto LAB_0014c80d;
    uVar10 = 9;
    uVar25 = 0;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x14c7c3;
    psVar32 = psVar51;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar51->modulus,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar5 == 0) {
      psVar32 = &sStack_268;
      uVar10 = 9;
      uVar25 = 0;
      psStack_310 = (secp256k1_modinv32_modinfo *)0x14c7e6;
      iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar5 == 0) {
        psVar32 = &sStack_2e8;
        uVar10 = 9;
        uVar25 = 1;
        psStack_310 = (secp256k1_modinv32_modinfo *)0x14c805;
        iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&psVar42->modulus,1);
        if (iVar5 == 0) goto LAB_0014c80d;
      }
    }
  }
  else {
LAB_0014c898:
    psStack_310 = (secp256k1_modinv32_modinfo *)0x14c89d;
    secp256k1_modinv32_cold_6();
  }
  psStack_310 = (secp256k1_modinv32_modinfo *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_02 = &sStack_360;
  piVar19 = (int *)(ulong)uVar25;
  pcStack_368 = (code *)0x14c8c2;
  psStack_318 = psVar50;
  psStack_310 = psVar51;
  secp256k1_modinv32_mul_30(&sStack_33c,&psVar32->modulus,uVar10,1);
  pcStack_368 = (code *)0x14c8d4;
  piVar40 = piVar19;
  psVar29 = a_00;
  secp256k1_modinv32_mul_30(&sStack_360,a_00,9,uVar25);
  lVar8 = 0;
  while ((uint)sStack_33c.v[lVar8] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_360.v[lVar8]) goto LAB_0014c926;
    lVar8 = lVar8 + 1;
    if (lVar8 == 8) {
      uVar25 = 8;
      while( true ) {
        if (sStack_33c.v[uVar25] < sStack_360.v[uVar25]) {
          return -1;
        }
        if (sStack_360.v[uVar25] < sStack_33c.v[uVar25]) break;
        bVar54 = uVar25 == 0;
        uVar25 = uVar25 - 1;
        if (bVar54) {
          return 0;
        }
      }
      return 1;
    }
  }
  pcStack_368 = (code *)0x14c926;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_0014c926:
  pcStack_368 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar5 = (int)a_02;
  piStack_390 = piVar19;
  psStack_388 = psVar42;
  uStack_380 = uVar47;
  uStack_370 = uVar52;
  pcStack_368 = (code *)puVar24;
  if (iVar5 < 1) {
    psStack_3a0 = (secp256k1_modinv32_signed30 *)0x14ca19;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_0014ca19:
    iVar12 = (int)piVar40;
    psStack_3a0 = (secp256k1_modinv32_signed30 *)0x14ca1e;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar11 = piVar40[1];
    iVar2 = *piVar40;
    piVar19 = (int *)(long)psVar29->v[0];
    uVar13 = (long)*extraout_RDX * (long)iVar11 + (long)piVar19 * (long)iVar2;
    if ((uVar13 & 0x3fffffff) != 0) goto LAB_0014ca19;
    iVar3 = piVar40[3];
    iVar12 = piVar40[2];
    piVar19 = (int *)((long)piVar19 * (long)iVar12);
    piVar40 = (int *)((long)*extraout_RDX * (long)iVar3 + (long)piVar19);
    if (((ulong)piVar40 & 0x3fffffff) == 0) {
      lVar14 = (long)piVar40 >> 0x1e;
      lVar8 = (long)uVar13 >> 0x1e;
      if (iVar5 != 1) {
        uVar52 = 1;
        do {
          lVar8 = (long)extraout_RDX[uVar52] * (long)iVar11 +
                  (long)psVar29->v[uVar52] * (long)iVar2 + lVar8;
          lVar14 = (long)extraout_RDX[uVar52] * (long)iVar3 +
                   (long)psVar29->v[uVar52] * (long)iVar12 + lVar14;
          psVar29->v[uVar52 - 1] = (uint)lVar8 & 0x3fffffff;
          extraout_RDX[uVar52 - 1] = (uint)lVar14 & 0x3fffffff;
          uVar52 = uVar52 + 1;
          lVar14 = lVar14 >> 0x1e;
          lVar8 = lVar8 >> 0x1e;
        } while (((ulong)a_02 & 0xffffffff) != uVar52);
      }
      psVar29->v[(long)iVar5 + -1] = (int)lVar8;
      extraout_RDX[(long)iVar5 + -1] = (int)lVar14;
      return (int)lVar8;
    }
  }
  psStack_3a0 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar8 = 0;
  psStack_3a0 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar8 < extraout_EDX) {
      psStack_3a0 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_3a0->v + (long)psVar29->v[lVar8] * (long)iVar12);
    }
    a_02->v[lVar8] = (uint)psStack_3a0 & 0x3fffffff;
    psStack_3a0 = (secp256k1_modinv32_signed30 *)((long)psStack_3a0 >> 0x1e);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  if (8 < extraout_EDX) {
    psStack_3a0 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_3a0->v + (long)psVar29->v[8] * (long)iVar12);
  }
  iVar5 = (int)psStack_3a0;
  b = (secp256k1_modinv32_signed30 *)(long)iVar5;
  if (b == psStack_3a0) {
    a_02->v[8] = iVar5;
    return iVar5;
  }
  pcStack_3a8 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar25 = *extraout_RDX_00;
  psVar48 = (secp256k1_modinv32_signed30 *)(long)(int)uVar25;
  uVar35 = extraout_RDX_00[1];
  lVar8 = (long)(int)uVar35;
  uVar37 = extraout_RDX_00[2];
  psVar20 = (secp256k1_modinv32_signed30 *)(long)(int)uVar37;
  lStack_3e0 = (long)(int)extraout_RDX_00[3];
  psVar30 = (secp256k1_fe *)0x9;
  pcStack_3f0 = (code *)0x14cab8;
  a_03 = a_02;
  piStack_3d0 = piVar19;
  psStack_3c8 = psVar42;
  uStack_3c0 = uVar47;
  uStack_3b0 = uVar52;
  pcStack_3a8 = (code *)puVar24;
  iVar5 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,-2);
  if (iVar5 < 1) {
    pcStack_3f0 = (code *)0x14cd20;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014cd20:
    pcStack_3f0 = (code *)0x14cd25;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014cd25:
    pcStack_3f0 = (code *)0x14cd2a;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014cd2a:
    pcStack_3f0 = (code *)0x14cd2f;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014cd2f:
    pcStack_3f0 = (code *)0x14cd34;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014cd34:
    pcStack_3f0 = (code *)0x14cd39;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014cd39:
    pcStack_3f0 = (code *)0x14cd3e;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014cd3e:
    pcStack_3f0 = (code *)0x14cd43;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar43 = b;
LAB_0014cd43:
    pcStack_3f0 = (code *)0x14cd48;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014cd48:
    pcStack_3f0 = (code *)0x14cd4d;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014cd4d:
    pcStack_3f0 = (code *)0x14cd52;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_3f0 = (code *)0x14cad5;
    a_03 = a_02;
    iVar5 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,1);
    if (-1 < iVar5) goto LAB_0014cd20;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_3f0 = (code *)0x14caf2;
    a_03 = psVar29;
    iVar5 = secp256k1_modinv32_mul_cmp_30(psVar29,9,b,-2);
    if (iVar5 < 1) goto LAB_0014cd25;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_3f0 = (code *)0x14cb0f;
    a_03 = psVar29;
    iVar5 = secp256k1_modinv32_mul_cmp_30(psVar29,9,b,1);
    if (-1 < iVar5) goto LAB_0014cd2a;
    psVar43 = (secp256k1_modinv32_signed30 *)-(long)psVar48;
    if (0 < (long)psVar48) {
      psVar43 = psVar48;
    }
    lVar14 = -lVar8;
    if (lVar8 < 1) {
      lVar14 = lVar8;
    }
    if (lVar14 + 0x40000000 < (long)psVar43) goto LAB_0014cd2f;
    psVar43 = (secp256k1_modinv32_signed30 *)-(long)psVar20;
    if (0 < (long)psVar20) {
      psVar43 = psVar20;
    }
    lVar14 = -lStack_3e0;
    if (lStack_3e0 < 1) {
      lVar14 = lStack_3e0;
    }
    if (lVar14 + 0x40000000 < (long)psVar43) goto LAB_0014cd34;
    uVar17 = a_02->v[8] >> 0x1f;
    uVar4 = psVar29->v[8] >> 0x1f;
    psVar30 = (secp256k1_fe *)(ulong)uVar4;
    iVar5 = (uVar4 & uVar35) + (uVar17 & uVar25);
    a_03 = (secp256k1_modinv32_signed30 *)(psVar29->v[0] * lVar8 + (long)a_02->v[0] * (long)psVar48)
    ;
    lVar14 = (long)(int)(iVar5 - ((int)a_03 * b[1].v[0] + iVar5 & 0x3fffffffU));
    piVar16 = (int32_t *)((long)a_03->v + lVar14 * b->v[0]);
    if (((ulong)piVar16 & 0x3fffffff) != 0) goto LAB_0014cd39;
    lStack_3d8 = lVar14;
    iVar5 = (uVar4 & (uint)lStack_3e0) + (uVar17 & uVar37);
    lVar15 = psVar29->v[0] * lStack_3e0 + (long)a_02->v[0] * (long)psVar20;
    a_03 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar25 = iVar5 - (b[1].v[0] * (int)lVar15 + iVar5 & 0x3fffffffU);
    psVar30 = (secp256k1_fe *)(ulong)uVar25;
    uVar52 = (long)b->v[0] * (long)(int)uVar25 + lVar15;
    if ((uVar52 & 0x3fffffff) != 0) goto LAB_0014cd3e;
    lVar15 = (long)uVar52 >> 0x1e;
    lVar28 = (long)piVar16 >> 0x1e;
    lVar33 = 1;
    do {
      lVar28 = b->v[lVar33] * lVar14 + psVar29->v[lVar33] * lVar8 +
               (long)a_02->v[lVar33] * (long)psVar48 + lVar28;
      psVar43 = (secp256k1_modinv32_signed30 *)(psVar29->v[lVar33] * lStack_3e0);
      lVar15 = (long)psVar43->v +
               (long)a_02->v[lVar33] * (long)psVar20 + lVar15 +
               (long)b->v[lVar33] * (long)(int)uVar25;
      a_02->v[lVar33 + -1] = (uint)lVar28 & 0x3fffffff;
      psVar29->v[lVar33 + -1] = (uint)lVar15 & 0x3fffffff;
      lVar33 = lVar33 + 1;
      lVar15 = lVar15 >> 0x1e;
      lVar28 = lVar28 >> 0x1e;
    } while (lVar33 != 9);
    a_02->v[8] = (int32_t)lVar28;
    psVar29->v[8] = (int32_t)lVar15;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_3f0 = (code *)0x14ccb9;
    a_03 = a_02;
    iVar5 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,-2);
    psVar20 = psVar29;
    psVar48 = b;
    if (iVar5 < 1) goto LAB_0014cd43;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_3f0 = (code *)0x14ccd6;
    a_03 = a_02;
    iVar5 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,1);
    if (-1 < iVar5) goto LAB_0014cd48;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_3f0 = (code *)0x14ccef;
    a_03 = psVar29;
    iVar5 = secp256k1_modinv32_mul_cmp_30(psVar29,9,b,-2);
    if (iVar5 < 1) goto LAB_0014cd4d;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_3f0 = (code *)0x14cd08;
    a_03 = psVar29;
    iVar5 = secp256k1_modinv32_mul_cmp_30(psVar29,9,b,1);
    if (iVar5 < 0) {
      return iVar5;
    }
  }
  pcStack_3f0 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_3f0 = (code *)lVar8;
  psStack_3f8 = a_02;
  psStack_400 = psVar29;
  psStack_408 = psVar48;
  psStack_410 = psVar43;
  psStack_418 = psVar20;
  uVar25 = a_03->v[0];
  uVar34 = (ulong)uVar25;
  uVar35 = a_03->v[3];
  uVar7 = (ulong)uVar35;
  uVar37 = a_03->v[4];
  uVar13 = (ulong)uVar37;
  uVar4 = a_03->v[5];
  uVar47 = (ulong)uVar4;
  psVar29 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_03->v[6];
  uVar17 = a_03->v[7];
  uVar52 = (ulong)uVar17;
  iStack_41c = a_03->v[8];
  lVar8 = 0;
  do {
    if (a_03->v[lVar8] < -0x3fffffff) {
      pcStack_458 = (code *)0x14d0a0;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014d0a0:
      pcStack_458 = (code *)0x14d0a5;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014d0a5;
    }
    if (0x3fffffff < a_03->v[lVar8]) goto LAB_0014d0a0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 9);
  uStack_43c = (uint)psVar30;
  psVar30 = (secp256k1_fe *)0x9;
  pcStack_458 = (code *)0x14cddd;
  psVar29 = a_03;
  uStack_448 = a_03->v[1];
  uStack_444 = a_03->v[2];
  uStack_440 = a_03->v[6];
  psStack_438 = b_00;
  iVar5 = secp256k1_modinv32_mul_cmp_30(a_03,9,b_00,-2);
  if (iVar5 < 1) {
LAB_0014d0a5:
    pcStack_458 = (code *)0x14d0aa;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014d0aa:
    pcStack_458 = (code *)0x14d0af;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014d0af:
    pcStack_458 = (code *)0x14d0b4;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014d0b4:
    pcStack_458 = (code *)0x14d0b9;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_458 = (code *)0x14cdfc;
    psVar29 = a_03;
    iVar5 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_438,1);
    if (-1 < iVar5) goto LAB_0014d0aa;
    uVar26 = iStack_41c >> 0x1f;
    uStack_420 = psStack_438->v[1];
    uVar10 = (uVar26 & uStack_420) + uStack_448;
    uStack_448 = psStack_438->v[2];
    uVar39 = (uVar26 & uStack_448) + uStack_444;
    uStack_444 = psStack_438->v[3];
    uStack_424 = psStack_438->v[4];
    uStack_428 = psStack_438->v[5];
    uStack_42c = psStack_438->v[6];
    uVar45 = (uVar26 & uStack_42c) + uStack_440;
    uStack_440 = psStack_438->v[7];
    uStack_44c = (int)uStack_43c >> 0x1f;
    uStack_43c = psStack_438->v[8];
    uVar41 = ((uVar26 & psStack_438->v[0]) + uVar25 ^ uStack_44c) - uStack_44c;
    uVar22 = ((int)uVar41 >> 0x1e) + ((uVar10 ^ uStack_44c) - uStack_44c);
    uVar10 = ((int)uVar22 >> 0x1e) + ((uVar39 ^ uStack_44c) - uStack_44c);
    uVar49 = ((int)uVar10 >> 0x1e) + (((uVar26 & uStack_444) + uVar35 ^ uStack_44c) - uStack_44c);
    uVar35 = ((int)uVar49 >> 0x1e) + (((uVar26 & uStack_424) + uVar37 ^ uStack_44c) - uStack_44c);
    uVar25 = ((int)uVar35 >> 0x1e) + (((uVar26 & uStack_428) + uVar4 ^ uStack_44c) - uStack_44c);
    uVar37 = ((int)uVar25 >> 0x1e) + ((uVar45 ^ uStack_44c) - uStack_44c);
    uVar4 = ((int)uVar37 >> 0x1e) + (((uVar26 & uStack_440) + uVar17 ^ uStack_44c) - uStack_44c);
    uVar23 = ((int)uVar4 >> 0x1e) + (((uVar26 & uStack_43c) + iStack_41c ^ uStack_44c) - uStack_44c)
    ;
    uVar47 = (ulong)uVar23;
    uStack_450 = (int)uVar23 >> 0x1f;
    uVar45 = (psStack_438->v[0] & uStack_450) + (uVar41 & 0x3fffffff);
    uVar39 = (uStack_428 & uStack_450) + (uVar25 & 0x3fffffff);
    uVar34 = (ulong)uVar39;
    uVar41 = (uStack_42c & uStack_450) + (uVar37 & 0x3fffffff);
    uVar7 = (ulong)uVar41;
    uVar25 = ((int)uVar45 >> 0x1e) + (uStack_420 & uStack_450) + (uVar22 & 0x3fffffff);
    uVar37 = ((int)uVar25 >> 0x1e) + (uStack_448 & uStack_450) + (uVar10 & 0x3fffffff);
    uVar17 = ((int)uVar37 >> 0x1e) + (uStack_444 & uStack_450) + (uVar49 & 0x3fffffff);
    uVar26 = ((int)uVar17 >> 0x1e) + (uStack_424 & uStack_450) + (uVar35 & 0x3fffffff);
    uVar39 = ((int)uVar26 >> 0x1e) + uVar39;
    uVar41 = ((int)uVar39 >> 0x1e) + uVar41;
    uVar35 = ((int)uVar41 >> 0x1e) + (uStack_440 & uStack_450) + (uVar4 & 0x3fffffff);
    uVar4 = ((int)uVar35 >> 0x1e) + (uStack_43c & uStack_450) + uVar23;
    uVar13 = (ulong)uVar4;
    uVar17 = uVar17 & 0x3fffffff;
    psVar30 = (secp256k1_fe *)(ulong)uVar17;
    uVar26 = uVar26 & 0x3fffffff;
    psVar29 = (secp256k1_modinv32_signed30 *)(ulong)uVar26;
    uVar35 = uVar35 & 0x3fffffff;
    uVar52 = (ulong)uVar35;
    a_03->v[0] = uVar45 & 0x3fffffff;
    a_03->v[1] = uVar25 & 0x3fffffff;
    a_03->v[2] = uVar37 & 0x3fffffff;
    a_03->v[3] = uVar17;
    a_03->v[4] = uVar26;
    a_03->v[5] = uVar39 & 0x3fffffff;
    a_03->v[6] = uVar41 & 0x3fffffff;
    a_03->v[7] = uVar35;
    a_03->v[8] = uVar4;
    if (0x3fffffff < uVar4) goto LAB_0014d0af;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_458 = (code *)0x14d06d;
    psVar29 = a_03;
    iVar5 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_438,0);
    if (iVar5 < 0) goto LAB_0014d0b4;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_458 = (code *)0x14d088;
    psVar29 = a_03;
    iVar5 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_438,1);
    if (iVar5 < 0) {
      return iVar5;
    }
  }
  pcStack_458 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  r = &sStack_518;
  psVar21 = &sStack_518;
  pcVar44 = secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    pcVar44 = secp256k1_fe_inv;
  }
  pcStack_520 = (code *)0x14d0ef;
  uStack_480 = uVar52;
  uStack_478 = uVar47;
  uStack_470 = uVar7;
  psStack_468 = a_03;
  uStack_460 = uVar34;
  pcStack_458 = (code *)uVar13;
  (*pcVar44)(&sStack_518);
  if (psVar29 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar29->v + 8) = sStack_518.n[4];
    *(ulong *)(psVar29[1].v + 1) = CONCAT44(sStack_518.normalized,sStack_518.magnitude);
    *(uint64_t *)(psVar29->v + 4) = sStack_518.n[2];
    *(uint64_t *)(psVar29->v + 6) = sStack_518.n[3];
    *(uint64_t *)psVar29->v = sStack_518.n[0];
    *(uint64_t *)(psVar29->v + 2) = sStack_518.n[1];
  }
  uVar13 = 0xffffffffffff;
  sStack_4b8.n[0] = psVar30->n[0];
  sStack_4b8.n[1] = psVar30->n[1];
  sStack_4b8.n[2] = psVar30->n[2];
  sStack_4b8.n[3] = psVar30->n[3];
  sStack_4b8.n[4] = psVar30->n[4];
  sStack_4b8.magnitude = psVar30->magnitude;
  sStack_4b8.normalized = psVar30->normalized;
  psVar31 = &sStack_4b8;
  pcStack_520 = (code *)0x14d158;
  secp256k1_fe_verify(psVar31);
  uVar52 = (sStack_4b8.n[4] >> 0x30) * 0x1000003d1 + sStack_4b8.n[0];
  if (((uVar52 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar52 & 0xfffffffffffff) == 0)) {
    uVar47 = (uVar52 >> 0x34) + sStack_4b8.n[1];
    uVar7 = (uVar47 >> 0x34) + sStack_4b8.n[2];
    uVar34 = (uVar7 >> 0x34) + sStack_4b8.n[3];
    uVar36 = (uVar34 >> 0x34) + (sStack_4b8.n[4] & 0xffffffffffff);
    if ((((uVar47 | uVar52 | uVar7 | uVar34) & 0xfffffffffffff) != 0 || uVar36 != 0) &&
       (((uVar52 | 0x1000003d0) & uVar47 & uVar7 & uVar34 & (uVar36 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014d1ff;
LAB_0014d5c9:
    pcStack_520 = (code *)0x14d5d4;
    secp256k1_fe_verify(&sStack_518);
    uVar13 = sStack_518.n[4] & 0xffffffffffff;
    uVar52 = (sStack_518.n[4] >> 0x30) * 0x1000003d1 + sStack_518.n[0];
    uVar47 = (uVar52 >> 0x34) + sStack_518.n[1];
    uVar7 = (uVar47 >> 0x34) + sStack_518.n[2];
    r = (secp256k1_fe *)((uVar7 >> 0x34) + sStack_518.n[3]);
    uVar34 = ((ulong)r >> 0x34) + uVar13;
    if (((uVar47 | uVar52 | uVar7 | (ulong)r) & 0xfffffffffffff) == 0 && uVar34 == 0) {
LAB_0014d650:
      return (int)uVar52;
    }
    r_00 = (secp256k1_fe *)(uVar34 ^ 0xf000000000000);
    uVar52 = (uVar52 ^ 0x1000003d0) & uVar47 & uVar7 & (ulong)r & (ulong)r_00;
    psVar21 = &sStack_518;
    if (uVar52 == 0xfffffffffffff) goto LAB_0014d650;
  }
  else {
LAB_0014d1ff:
    pcStack_520 = (code *)0x14d212;
    psVar31 = psVar30;
    secp256k1_fe_mul(&sStack_4b8,psVar30,&sStack_518);
    pcStack_520 = (code *)0x14d21a;
    secp256k1_fe_verify(&sStack_4b8);
    r_00 = &fe_minus_one;
    pcStack_520 = (code *)0x14d226;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_4b8.magnitude < 0x20) {
      sStack_4b8.n[0] = sStack_4b8.n[0] + 0xffffefffffc2e;
      sStack_4b8.n[1] = sStack_4b8.n[1] + 0xfffffffffffff;
      sStack_4b8.n[2] = sStack_4b8.n[2] + 0xfffffffffffff;
      sStack_4b8.n[3] = sStack_4b8.n[3] + 0xfffffffffffff;
      sStack_4b8.n[4] = sStack_4b8.n[4] + 0xffffffffffff;
      sStack_4b8.normalized = 0;
      sStack_4b8.magnitude = sStack_4b8.magnitude + 1;
      pcStack_520 = (code *)0x14d278;
      secp256k1_fe_verify(&sStack_4b8);
      pcStack_520 = (code *)0x14d280;
      secp256k1_fe_verify(&sStack_4b8);
      uVar52 = (sStack_4b8.n[4] >> 0x30) * 0x1000003d1 + sStack_4b8.n[0];
      uVar47 = (uVar52 >> 0x34) + sStack_4b8.n[1];
      uVar7 = (uVar47 >> 0x34) + sStack_4b8.n[2];
      psVar31 = (secp256k1_fe *)((uVar7 >> 0x34) + sStack_4b8.n[3]);
      uVar34 = ((ulong)psVar31 >> 0x34) + (sStack_4b8.n[4] & 0xffffffffffff);
      if ((((uVar47 | uVar52 | uVar7 | (ulong)psVar31) & 0xfffffffffffff) != 0 || uVar34 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar34 ^ 0xf000000000000),
         ((uVar52 ^ 0x1000003d0) & uVar47 & uVar7 & (ulong)psVar31 & (ulong)r_00) != 0xfffffffffffff
         )) goto LAB_0014d667;
      sStack_4e8.n[0] = psVar30->n[0];
      sStack_4e8.n[1] = psVar30->n[1];
      sStack_4e8.n[2] = psVar30->n[2];
      sStack_4e8.n[3] = psVar30->n[3];
      sStack_4e8.n[4] = psVar30->n[4];
      sStack_4e8.magnitude = psVar30->magnitude;
      sStack_4e8.normalized = psVar30->normalized;
      psVar30 = &sStack_4e8;
      pcStack_520 = (code *)0x14d326;
      secp256k1_fe_verify(psVar30);
      r_00 = &fe_minus_one;
      pcStack_520 = (code *)0x14d332;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_4e8.magnitude) goto LAB_0014d66c;
      sStack_4e8.n[0] = sStack_4e8.n[0] + 0xffffefffffc2e;
      sStack_4e8.n[1] = sStack_4e8.n[1] + 0xfffffffffffff;
      sStack_4e8.n[2] = sStack_4e8.n[2] + 0xfffffffffffff;
      sStack_4e8.n[3] = sStack_4e8.n[3] + 0xfffffffffffff;
      sStack_4e8.n[4] = sStack_4e8.n[4] + 0xffffffffffff;
      sStack_4e8.normalized = 0;
      sStack_4e8.magnitude = sStack_4e8.magnitude + 1;
      pcStack_520 = (code *)0x14d37d;
      secp256k1_fe_verify(&sStack_4e8);
      pcStack_520 = (code *)0x14d385;
      secp256k1_fe_verify(&sStack_4e8);
      uVar52 = (sStack_4e8.n[4] >> 0x30) * 0x1000003d1 + sStack_4e8.n[0];
      if (((uVar52 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar52 & 0xfffffffffffff) == 0)) {
        uVar47 = (uVar52 >> 0x34) + sStack_4e8.n[1];
        uVar7 = (uVar47 >> 0x34) + sStack_4e8.n[2];
        uVar34 = (uVar7 >> 0x34) + sStack_4e8.n[3];
        uVar36 = (uVar34 >> 0x34) + (sStack_4e8.n[4] & 0xffffffffffff);
        if ((((uVar47 | uVar52 | uVar7 | uVar34) & 0xfffffffffffff) == 0 && uVar36 == 0) ||
           (uVar52 = (uVar52 | 0x1000003d0) & uVar47 & uVar7 & uVar34 & (uVar36 ^ 0xf000000000000),
           uVar52 == 0xfffffffffffff)) goto LAB_0014d650;
      }
      psVar31 = &sStack_4e8;
      pcStack_520 = (code *)0x14d434;
      (*pcVar44)();
      pcStack_520 = (code *)0x14d43f;
      secp256k1_fe_verify(&sStack_518);
      r_00 = &fe_minus_one;
      pcStack_520 = (code *)0x14d44b;
      secp256k1_fe_verify(&fe_minus_one);
      psVar30 = &sStack_518;
      if (0x1f < sStack_518.magnitude) goto LAB_0014d671;
      sStack_518.n[0] = sStack_518.n[0] + 0xffffefffffc2e;
      sStack_518.n[1] = sStack_518.n[1] + 0xfffffffffffff;
      sStack_518.n[2] = sStack_518.n[2] + 0xfffffffffffff;
      sStack_518.n[3] = sStack_518.n[3] + 0xfffffffffffff;
      sStack_518.n[4] = sStack_518.n[4] + 0xffffffffffff;
      sStack_518.magnitude = sStack_518.magnitude + 1;
      sStack_518.normalized = 0;
      pcStack_520 = (code *)0x14d494;
      secp256k1_fe_verify(&sStack_518);
      pcStack_520 = (code *)0x14d49d;
      (*pcVar44)(&sStack_518);
      pcStack_520 = (code *)0x14d4a5;
      secp256k1_fe_verify(&sStack_518);
      sStack_518.n[0] = sStack_518.n[0] + 1;
      sStack_518.magnitude = sStack_518.magnitude + 1;
      sStack_518.normalized = 0;
      pcStack_520 = (code *)0x14d4b7;
      secp256k1_fe_verify(&sStack_518);
      pcStack_520 = (code *)0x14d4bf;
      secp256k1_fe_verify(&sStack_518);
      psVar31 = &sStack_4e8;
      pcStack_520 = (code *)0x14d4cc;
      r_00 = psVar31;
      secp256k1_fe_verify(psVar31);
      if (sStack_4e8.magnitude + sStack_518.magnitude < 0x21) {
        sStack_518.n[0] = sStack_518.n[0] + sStack_4e8.n[0];
        sStack_518.n[1] = sStack_518.n[1] + sStack_4e8.n[1];
        sStack_518.n[2] = sStack_518.n[2] + sStack_4e8.n[2];
        sStack_518.n[3] = sStack_518.n[3] + sStack_4e8.n[3];
        sStack_518.n[4] = sStack_518.n[4] + sStack_4e8.n[4];
        sStack_518.normalized = 0;
        pcStack_520 = (code *)0x14d518;
        sStack_518.magnitude = sStack_4e8.magnitude + sStack_518.magnitude;
        secp256k1_fe_verify(&sStack_518);
        pcStack_520 = (code *)0x14d520;
        secp256k1_fe_verify(&sStack_518);
        uVar52 = (sStack_518.n[4] >> 0x30) * 0x1000003d1 + sStack_518.n[0];
        if (((uVar52 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar52 & 0xfffffffffffff) == 0)) {
          uVar13 = (uVar52 >> 0x34) + sStack_518.n[1];
          uVar47 = (uVar13 >> 0x34) + sStack_518.n[2];
          uVar7 = (uVar47 >> 0x34) + sStack_518.n[3];
          uVar34 = (uVar7 >> 0x34) + (sStack_518.n[4] & 0xffffffffffff);
          if ((((uVar13 | uVar52 | uVar47 | uVar7) & 0xfffffffffffff) == 0 && uVar34 == 0) ||
             (uVar52 = (uVar52 | 0x1000003d0) & uVar13 & uVar47 & uVar7 & (uVar34 ^ 0xf000000000000)
             , uVar52 == 0xfffffffffffff)) goto LAB_0014d650;
        }
        pcStack_520 = (code *)0x14d5c9;
        test_inverse_field_cold_2();
        goto LAB_0014d5c9;
      }
    }
    else {
      pcStack_520 = (code *)0x14d667;
      test_inverse_field_cold_7();
LAB_0014d667:
      pcStack_520 = (code *)0x14d66c;
      test_inverse_field_cold_6();
LAB_0014d66c:
      pcStack_520 = (code *)0x14d671;
      test_inverse_field_cold_5();
LAB_0014d671:
      r = psVar31;
      psVar21 = psVar30;
      psVar31 = &sStack_4b8;
      pcStack_520 = (code *)0x14d676;
      test_inverse_field_cold_4();
    }
    pcStack_520 = (code *)0x14d67b;
    test_inverse_field_cold_3();
  }
  pcStack_520 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcStack_520 = (code *)0xfffffffffffff;
  psVar30 = (secp256k1_fe *)auStack_590;
  pcVar53 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar53 = secp256k1_scalar_inverse;
  }
  pcStack_598 = (code *)0x14d6a9;
  auStack_550._32_8_ = psVar21;
  auStack_550._40_8_ = psVar31;
  (*pcVar53)(auStack_590);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_590._20_4_,auStack_590._16_4_);
    r_00->n[3] = CONCAT44(auStack_590._28_4_,auStack_590._24_4_);
    r_00->n[0] = CONCAT44(auStack_590._4_4_,auStack_590._0_4_);
    r_00->n[1] = CONCAT44(auStack_590._12_4_,auStack_590._8_4_);
  }
  pcStack_598 = (code *)0x14d6c8;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar58._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar58._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar58._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar58._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar5 = movmskps(extraout_EAX,auVar58);
  if (iVar5 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_550;
    pcStack_598 = (code *)0x14d6fc;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_590);
    pcStack_598 = (code *)0x14d704;
    psVar21 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_550._0_8_ != 1 || auStack_550._8_8_ != 0) || auStack_550._16_8_ != 0) ||
        auStack_550._24_8_ != 0) {
      pcStack_598 = (code *)0x14d80e;
      test_inverse_scalar_cold_1();
      goto LAB_0014d80e;
    }
    pcStack_598 = (code *)0x14d734;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_590 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_598 = (code *)0x14d73c;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_590 + 0x20));
    auVar55._0_4_ = -(uint)(iStack_560 == 0 && auStack_590._32_4_ == 0);
    auVar55._4_4_ = -(uint)(iStack_55c == 0 && iStack_56c == 0);
    auVar55._8_4_ = -(uint)(iStack_558 == 0 && iStack_568 == 0);
    auVar55._12_4_ = -(uint)(iStack_554 == 0 && iStack_564 == 0);
    uVar25 = movmskps(extraout_EAX_00,auVar55);
    if (uVar25 == 0xf) {
      return 0;
    }
    a = (secp256k1_scalar *)(auStack_590 + 0x20);
    pcStack_598 = (code *)0x14d76d;
    (*pcVar53)(a,a);
    pcStack_598 = (code *)0x14d782;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_590,&scalar_minus_one,(secp256k1_scalar *)auStack_590);
    pcStack_598 = (code *)0x14d78b;
    (*pcVar53)(auStack_590,auStack_590);
    pcStack_598 = (code *)0x14d79d;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_590,(secp256k1_scalar *)auStack_590,&secp256k1_scalar_one
              );
    pcStack_598 = (code *)0x14d7ab;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_590,a,(secp256k1_scalar *)auStack_590);
    pcStack_598 = (code *)0x14d7b3;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_590);
    auVar56._0_4_ = -(uint)(auStack_590._16_4_ == 0 && auStack_590._0_4_ == 0);
    auVar56._4_4_ = -(uint)(auStack_590._20_4_ == 0 && auStack_590._4_4_ == 0);
    auVar56._8_4_ = -(uint)(auStack_590._24_4_ == 0 && auStack_590._8_4_ == 0);
    auVar56._12_4_ = -(uint)(auStack_590._28_4_ == 0 && auStack_590._12_4_ == 0);
    uVar25 = movmskps(extraout_EAX_01,auVar56);
    if (uVar25 == 0xf) {
      return 0;
    }
    pcStack_598 = (code *)0x14d7d7;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_590;
  }
  pcStack_598 = (code *)0x14d7e2;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_590);
  auVar57._0_4_ = -(uint)(auStack_590._16_4_ == 0 && auStack_590._0_4_ == 0);
  auVar57._4_4_ = -(uint)(auStack_590._20_4_ == 0 && auStack_590._4_4_ == 0);
  auVar57._8_4_ = -(uint)(auStack_590._24_4_ == 0 && auStack_590._8_4_ == 0);
  auVar57._12_4_ = -(uint)(auStack_590._28_4_ == 0 && auStack_590._12_4_ == 0);
  uVar25 = movmskps(extraout_EAX_02,auVar57);
  r = (secp256k1_fe *)auStack_590;
  psVar21 = psVar30;
  if (uVar25 == 0xf) {
    return 0;
  }
LAB_0014d80e:
  pcStack_598 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_5b0 = 0x1000003d1;
  __s = auStack_1648;
  psStack_5c0 = r;
  pcStack_5b8 = pcVar44;
  psStack_5a8 = r_00;
  pcStack_5a0 = pcVar53;
  pcStack_598 = (code *)uVar13;
  memset(__s,0,0x1081);
  uStack_1658 = 0;
  lVar8 = 0x41;
  psStack_1650 = psVar21;
  secp256k1_hsort(__s,0x41,(size_t)psVar21,test_hsort_cmp,&uStack_1658);
  if (0x3f < uStack_1658) {
    test_hsort_is_sorted(auStack_1648,0x41,(size_t)psVar21);
    iVar5 = extraout_EAX_03;
    if (0 < COUNT) {
      iVar11 = 0;
      do {
        uVar6 = testrand_int(0x41);
        count = (size_t)(int)uVar6;
        testrand_bytes_test(auStack_1648,count * (long)psVar21);
        secp256k1_hsort(auStack_1648,count,(size_t)psVar21,test_hsort_cmp,&uStack_1658);
        test_hsort_is_sorted(auStack_1648,count,(size_t)psVar21);
        iVar11 = iVar11 + 1;
        iVar5 = extraout_EAX_04;
      } while (iVar11 < COUNT);
    }
    return iVar5;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar14 = 0;
    uVar52 = extraout_RAX;
    do {
      uVar13 = uVar52 & 0xffffffff;
      bVar9 = __s[lVar14];
      bVar1 = *(byte *)(lVar8 + lVar14);
      uVar52 = (ulong)((uint)bVar9 - (uint)bVar1);
      if (bVar9 == bVar1) {
        uVar52 = uVar13;
      }
      if (bVar9 != bVar1) {
        return (int)uVar52;
      }
      lVar14 = lVar14 + 1;
    } while (extraout_RDX_01[1] != lVar14);
  }
  return 0;
}

Assistant:

static int secp256k1_jacobi32_maybe_var(const secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 */
    int32_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0 && g.v[5] >= 0 && g.v[6] >= 0 && g.v[7] >= 0 && g.v[8] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4] | g.v[5] | g.v[6] | g.v[7] | g.v[8]) != 0);

    for (count = 0; count < JACOBI32_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 30 posdivsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_posdivsteps_30_var(eta, f.v[0] | ((uint32_t)f.v[1] << 30), g.v[0] | ((uint32_t)g.v[1] << 30), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. If f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1500 iterations. Return 0, indicating unknown result. */
    return 0;
}